

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

void __thiscall icu_63::UnicodeString::UnicodeString(UnicodeString *this,UChar32 ch)

{
  bool bVar1;
  int32_t local_18;
  UBool isError;
  int32_t i;
  UChar32 ch_local;
  UnicodeString *this_local;
  
  Replaceable::Replaceable(&this->super_Replaceable);
  (this->super_Replaceable).super_UObject._vptr_UObject = (_func_int **)&PTR__UnicodeString_002b17b8
  ;
  (this->fUnion).fStackFields.fLengthAndFlags = 2;
  local_18 = 0;
  bVar1 = false;
  if ((uint)ch < 0x10000) {
    local_18 = 1;
    (this->fUnion).fStackFields.fBuffer[0] = (char16_t)ch;
  }
  else {
    bVar1 = 0x10ffff < (uint)ch;
    if (!bVar1) {
      (this->fUnion).fStackFields.fBuffer[0] = (short)(ch >> 10) + L'ퟀ';
      local_18 = 2;
      (this->fUnion).fStackFields.fBuffer[1] = (char16_t)ch & 0x3ffU | 0xdc00;
    }
  }
  if (!bVar1) {
    setShortLength(this,local_18);
  }
  return;
}

Assistant:

UnicodeString::UnicodeString(UChar32 ch) {
  fUnion.fFields.fLengthAndFlags = kShortString;
  int32_t i = 0;
  UBool isError = FALSE;
  U16_APPEND(fUnion.fStackFields.fBuffer, i, US_STACKBUF_SIZE, ch, isError);
  // We test isError so that the compiler does not complain that we don't.
  // If isError then i==0 which is what we want anyway.
  if(!isError) {
    setShortLength(i);
  }
}